

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O3

void spvtools::opt::anon_unknown_27::GetBlocksInPath
               (uint32_t block,uint32_t entry,
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *blocks_in_path,CFG *cfg)

{
  pointer puVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  pointer puVar3;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar4;
  uint32_t pid;
  uint32_t local_44;
  CFG *local_40;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_38;
  
  local_40 = cfg;
  pvVar2 = CFG::preds(cfg,block);
  puVar3 = (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar3 != puVar1) {
    do {
      local_44 = *puVar3;
      local_38 = blocks_in_path;
      pVar4 = std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)blocks_in_path,&local_44,&local_38);
      if ((((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
         (local_44 != entry)) {
        GetBlocksInPath(local_44,entry,blocks_in_path,local_40);
      }
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
  }
  return;
}

Assistant:

void GetBlocksInPath(uint32_t block, uint32_t entry,
                     std::unordered_set<uint32_t>* blocks_in_path,
                     const CFG& cfg) {
  for (uint32_t pid : cfg.preds(block)) {
    if (blocks_in_path->insert(pid).second) {
      if (pid != entry) {
        GetBlocksInPath(pid, entry, blocks_in_path, cfg);
      }
    }
  }
}